

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O1

Dec_Edge_t
Abc_NodeEvaluateDsd_rec
          (Dec_Graph_t *pGraph,Abc_ManRst_t *pManRst,Dsd_Node_t *pNodeDsd,int Required,
          int nNodesSaved,int *pnNodesAdded)

{
  DdHalfWord DVar1;
  int iVar2;
  void *pvVar3;
  Dec_Node_t *pDVar4;
  long lVar5;
  void *pvVar6;
  uint *__ptr;
  size_t sVar7;
  int *pnNodesAdded_00;
  Dsd_Type_t DVar8;
  int iVar9;
  int iVar10;
  Dec_Edge_t DVar11;
  DdNode *pDVar12;
  Vec_Int_t *vEdges;
  int *piVar13;
  Dsd_Node_t *pNodeDsd_00;
  Abc_Obj_t *pAVar14;
  Dec_Node_t *pDVar15;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  Abc_Obj_t *pAVar16;
  uint uVar17;
  int Fill;
  int Fill_00;
  int Fill_01;
  ulong uVar18;
  Abc_Obj_t *pAVar19;
  ulong uVar20;
  Abc_Aig_t *pAVar21;
  uint uVar22;
  uint uVar23;
  Dec_Edge_t DVar24;
  ulong uVar25;
  Dsd_Node_t *p;
  ulong uVar26;
  long *plVar27;
  ulong uVar28;
  uint uVar29;
  Dec_Edge_t DVar30;
  bool bVar31;
  bool bVar32;
  int Type;
  int local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  int *local_a0;
  ulong local_98;
  Abc_Obj_t *local_90;
  int local_88;
  int local_84;
  Vec_Int_t *local_80;
  ulong local_78;
  ulong local_70;
  Abc_Obj_t *local_68;
  Dsd_Node_t *local_60;
  Abc_Obj_t *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  p = (Dsd_Node_t *)((ulong)pNodeDsd & 0xfffffffffffffffe);
  local_a0 = pnNodesAdded;
  local_88 = Required;
  local_84 = nNodesSaved;
  DVar8 = Dsd_NodeReadType(p);
  if (DVar8 == DSD_NODE_BUF) {
    pDVar12 = Dsd_NodeReadFunc(p);
    if ((int)pDVar12->index < pGraph->nLeaves) {
      return (Dec_Edge_t)(((uint)pNodeDsd & 1) + (pDVar12->index & 0x3fffffff) * 2);
    }
    __assert_fail("Index < Dec_GraphLeaveNum(pGraph)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x261,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  local_60 = pNodeDsd;
  if (2 < DVar8 - DSD_NODE_OR) {
    __assert_fail("DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x265,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  iVar9 = Dsd_NodeReadDecsNum(p);
  vEdges = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar10 = iVar9;
  }
  vEdges->nSize = 0;
  vEdges->nCap = iVar10;
  if (iVar10 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar10 << 2);
  }
  pnNodesAdded_00 = local_a0;
  vEdges->pArray = piVar13;
  iVar10 = Dsd_NodeReadDecsNum(p);
  if (0 < iVar10) {
    iVar10 = 0;
    do {
      pNodeDsd_00 = Dsd_NodeReadDec(p,iVar10);
      DVar11 = Abc_NodeEvaluateDsd_rec(pGraph,pManRst,pNodeDsd_00,local_88,local_84,pnNodesAdded_00)
      ;
      if (((uint)DVar11 & 0x7ffffffe) == 0xfac) goto LAB_002a0fd7;
      if (DVar8 == DSD_NODE_PRIME) {
        Vec_IntPush(vEdges,(int)DVar11);
      }
      else {
        Abc_NodeEdgeDsdPushOrdered(pGraph,vEdges,(int)DVar11);
      }
      iVar10 = iVar10 + 1;
      iVar9 = Dsd_NodeReadDecsNum(p);
    } while (iVar10 < iVar9);
  }
  local_80 = vEdges;
  if (DVar8 == DSD_NODE_EXOR) {
    if (vEdges->nSize < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x2b5,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    iVar10 = vEdges->nSize;
    while (1 < iVar10) {
      if (iVar10 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,vEdges,1);
      }
      iVar10 = vEdges->nSize;
      if (iVar10 < 1) goto LAB_002a15c5;
      vEdges->nSize = iVar10 - 1U;
      if (iVar10 == 1) goto LAB_002a15c5;
      uVar17 = vEdges->pArray[iVar10 - 1U];
      DVar11 = (Dec_Edge_t)(uVar17 & 0x7fffffff);
      vEdges->nSize = iVar10 - 2U;
      uVar29 = vEdges->pArray[iVar10 - 2U];
      DVar30 = (Dec_Edge_t)(uVar29 & 0x7fffffff);
      local_b0 = (ulong)((uint)DVar11 >> 1) * 3;
      pvVar3 = pGraph->pNodes[(uint)DVar11 >> 1].field_2.pFunc;
      local_98 = (ulong)((uint)DVar30 >> 1) * 3;
      pvVar6 = pGraph->pNodes[(uint)DVar30 >> 1].field_2.pFunc;
      local_a8 = (Abc_Obj_t *)((ulong)(uVar17 & 1) ^ (ulong)pvVar3);
      if (pvVar3 == (void *)0x0) {
        local_a8 = (Abc_Obj_t *)0x0;
      }
      uVar29 = uVar29 & 1;
      local_90 = (Abc_Obj_t *)((ulong)uVar29 ^ (ulong)pvVar6);
      if (pvVar6 == (void *)0x0) {
        local_90 = (Abc_Obj_t *)0x0;
      }
      local_b4 = 0;
      local_78 = CONCAT71(local_78._1_7_,
                          local_90 != (Abc_Obj_t *)0x0 && local_a8 != (Abc_Obj_t *)0x0);
      if (local_90 != (Abc_Obj_t *)0x0 && local_a8 != (Abc_Obj_t *)0x0) {
        pAVar14 = Abc_AigXorLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,local_a8,local_90,&local_b4)
        ;
      }
      else {
        pAVar14 = (Abc_Obj_t *)0x0;
      }
      if (local_b4 == 0) {
        if (pGraph->nSize == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar10 = pGraph->nSize;
        pGraph->nSize = iVar10 + 1;
        pDVar15 = pDVar4 + iVar10;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar10].field_0x10 = 0;
        pDVar4[iVar10].eEdge0 = (Dec_Edge_t)((uint)DVar11 ^ 1);
        pDVar4[iVar10].eEdge1 = DVar30;
        *(uint *)&pDVar4[iVar10].field_0x10 = uVar29 << 0x10 | (((uint)DVar11 ^ 1) & 1) << 0xf;
        iVar10 = pGraph->nSize;
        if (iVar10 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        uVar20 = local_98;
        pDVar4 = pGraph->pNodes;
        iVar9 = pGraph->nSize;
        pGraph->nSize = iVar9 + 1;
        pDVar15 = pDVar4 + iVar9;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar9].field_0x10 = 0;
        pDVar4[iVar9].eEdge0 = DVar11;
        pDVar4[iVar9].eEdge1 = (Dec_Edge_t)((uint)DVar30 ^ 1);
        *(uint *)&pDVar4[iVar9].field_0x10 = (((uint)DVar30 ^ 1) & 1) << 0x10 | (uVar17 & 1) << 0xf;
        iVar9 = pGraph->nSize;
        if (iVar9 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar15 = pDVar4 + iVar2;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        *(undefined4 *)&pDVar4[iVar2].field_0x10 = 0x4000;
        pDVar4[iVar2].eEdge0 = (Dec_Edge_t)(iVar10 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar4[iVar2].eEdge1 = (Dec_Edge_t)(iVar9 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar17 = (pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1;
        uVar18 = local_b0;
      }
      else {
        if (pGraph->nSize == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        uVar18 = local_b0;
        pDVar4 = pGraph->pNodes;
        iVar10 = pGraph->nSize;
        pGraph->nSize = iVar10 + 1;
        pDVar15 = pDVar4 + iVar10;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar10].field_0x10 = 0;
        pDVar4[iVar10].eEdge0 = DVar11;
        pDVar4[iVar10].eEdge1 = DVar30;
        *(uint *)&pDVar4[iVar10].field_0x10 = uVar29 << 0x10 | (uVar17 & 1) << 0xf;
        iVar10 = pGraph->nSize;
        if (iVar10 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar9 = pGraph->nSize;
        pGraph->nSize = iVar9 + 1;
        pDVar15 = pDVar4 + iVar9;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar9].field_0x10 = 0;
        pDVar4[iVar9].eEdge0 = (Dec_Edge_t)((uint)DVar11 ^ 1);
        pDVar4[iVar9].eEdge1 = (Dec_Edge_t)((uint)DVar30 ^ 1);
        *(uint *)&pDVar4[iVar9].field_0x10 =
             (((uint)DVar30 ^ 1) & 1) << 0x10 | (((uint)DVar11 ^ 1) & 1) << 0xf;
        iVar9 = pGraph->nSize;
        if (iVar9 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar15 = pDVar4 + iVar2;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        *(undefined4 *)&pDVar4[iVar2].field_0x10 = 0x4000;
        pDVar4[iVar2].eEdge0 = (Dec_Edge_t)(iVar10 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar4[iVar2].eEdge1 = (Dec_Edge_t)(iVar9 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar17 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
        uVar20 = local_98;
      }
      pDVar15 = pGraph->pNodes;
      uVar23 = *(uint *)(&pDVar15->field_0x10 + uVar18 * 8) & 0x3fff;
      uVar29 = *(uint *)(&pDVar15->field_0x10 + uVar20 * 8) & 0x3fff;
      if (uVar29 < uVar23) {
        uVar29 = uVar23;
      }
      uVar23 = uVar17 >> 1;
      *(uint *)&pDVar15[uVar23].field_0x10 =
           *(uint *)&pDVar15[uVar23].field_0x10 & 0xffffc000 | uVar29 + 2 & 0x3fff;
      if (pAVar14 == (Abc_Obj_t *)0x0) {
LAB_002a0a1a:
        piVar13 = local_a0;
        iVar10 = *local_a0;
        *local_a0 = iVar10 + 1;
        if ((char)local_78 == '\0') {
          iVar10 = iVar10 + 3;
LAB_002a0bbe:
          *piVar13 = iVar10;
        }
        else {
          pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          if (local_b4 == 0) {
            pAVar14 = Abc_AigAndLookup(pAVar21,local_a8,(Abc_Obj_t *)((ulong)local_90 ^ 1));
            if (pAVar14 == (Abc_Obj_t *)0x0) {
LAB_002a0b41:
              *piVar13 = *piVar13 + 1;
            }
            else {
              plVar27 = (long *)((ulong)pAVar14 & 0xfffffffffffffffe);
              lVar5 = *plVar27;
              iVar10 = (int)plVar27[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,Fill_00);
              if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002a15e4;
              piVar13 = local_a0;
              if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar27 + 0xd8))
              goto LAB_002a0b41;
            }
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar14 = (Abc_Obj_t *)((ulong)local_a8 ^ 1);
          }
          else {
            pAVar14 = Abc_AigAndLookup(pAVar21,(Abc_Obj_t *)((ulong)local_a8 ^ 1),
                                       (Abc_Obj_t *)((ulong)local_90 ^ 1));
            if (pAVar14 == (Abc_Obj_t *)0x0) {
LAB_002a0ab4:
              *piVar13 = *piVar13 + 1;
            }
            else {
              plVar27 = (long *)((ulong)pAVar14 & 0xfffffffffffffffe);
              lVar5 = *plVar27;
              iVar10 = (int)plVar27[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,Fill);
              if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002a15e4;
              piVar13 = local_a0;
              if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar27 + 0xd8))
              goto LAB_002a0ab4;
            }
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar14 = local_a8;
          }
          pAVar14 = Abc_AigAndLookup(pAVar21,pAVar14,local_90);
          if (pAVar14 == (Abc_Obj_t *)0x0) {
LAB_002a0bba:
            iVar10 = *piVar13 + 1;
            goto LAB_002a0bbe;
          }
          plVar27 = (long *)((ulong)pAVar14 & 0xfffffffffffffffe);
          lVar5 = *plVar27;
          iVar10 = (int)plVar27[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,Fill_01);
          if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002a15e4;
          piVar13 = local_a0;
          if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar27 + 0xd8))
          goto LAB_002a0bba;
        }
        vEdges = local_80;
        if (local_84 < *piVar13) {
          if (local_80->pArray != (int *)0x0) {
            free(local_80->pArray);
            vEdges->pArray = (int *)0x0;
          }
          if (vEdges == (Vec_Int_t *)0x0) {
            return (Dec_Edge_t)0xfac;
          }
          goto LAB_002a0ffd;
        }
      }
      else {
        pDVar15 = pGraph->pNodes;
        pDVar15[uVar23].field_2.pFunc = (void *)((ulong)(uVar17 & 1) ^ (ulong)pAVar14);
        if ((local_88 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar23].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x2d2,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        plVar27 = (long *)((ulong)pAVar14 & 0xfffffffffffffffe);
        lVar5 = *plVar27;
        iVar10 = (int)plVar27[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,(int)pDVar15);
        if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002a15e4;
        if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar27 + 0xd8))
        goto LAB_002a0a1a;
      }
      vEdges = local_80;
      Abc_NodeEdgeDsdPushOrdered(pGraph,local_80,uVar17);
      iVar10 = vEdges->nSize;
    }
  }
  else {
    if (DVar8 != DSD_NODE_OR) {
      if (DVar8 != DSD_NODE_PRIME) {
LAB_002a0fd7:
        if (vEdges->pArray != (int *)0x0) {
          free(vEdges->pArray);
          vEdges->pArray = (int *)0x0;
        }
        if (vEdges == (Vec_Int_t *)0x0) {
          return (Dec_Edge_t)0xfac;
        }
LAB_002a0ffd:
        free(vEdges);
        return (Dec_Edge_t)0xfac;
      }
      n = Dsd_TreeGetPrimeFunction(pManRst->dd,p);
      Cudd_Ref(n);
      pDVar12 = *pManRst->dd->vars;
      n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
      Cudd_Ref(n_00);
      n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
      Cudd_Ref(n_01);
      iVar10 = Extra_bddIsVar(n_00);
      if ((iVar10 == 0) || (iVar10 = Extra_bddIsVar(n_01), iVar10 == 0)) {
        Cudd_RecursiveDeref(pManRst->dd,n_00);
        Cudd_RecursiveDeref(pManRst->dd,n_01);
        pDVar12 = pManRst->dd->vars[1];
        n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
        Cudd_Ref(n_00);
        n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
        Cudd_Ref(n_01);
        iVar10 = Extra_bddIsVar(n_00);
        if ((iVar10 == 0) || (iVar10 = Extra_bddIsVar(n_01), iVar10 == 0)) {
          Cudd_RecursiveDeref(pManRst->dd,n_00);
          Cudd_RecursiveDeref(pManRst->dd,n_01);
          pDVar12 = pManRst->dd->vars[2];
          n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
          Cudd_Ref(n_00);
          n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
          Cudd_Ref(n_01);
          iVar10 = Extra_bddIsVar(n_00);
          if ((iVar10 == 0) || (iVar10 = Extra_bddIsVar(n_01), iVar10 == 0)) {
            Cudd_RecursiveDeref(pManRst->dd,n_00);
            Cudd_RecursiveDeref(pManRst->dd,n_01);
            Cudd_RecursiveDeref(pManRst->dd,n);
            goto LAB_002a1593;
          }
        }
      }
      Cudd_RecursiveDeref(pManRst->dd,n);
      DVar1 = pDVar12->index;
      if (((long)(int)DVar1 < 0) || (iVar10 = local_80->nSize, iVar10 <= (int)DVar1)) {
LAB_002a15e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = *(int *)((ulong)n_01 & 0xfffffffffffffffe);
      if (((long)iVar9 < 0) || (iVar10 <= iVar9)) goto LAB_002a15e4;
      iVar2 = *(int *)((ulong)n_00 & 0xfffffffffffffffe);
      if (((long)iVar2 < 0) || (iVar10 <= iVar2)) goto LAB_002a15e4;
      piVar13 = local_80->pArray;
      local_78 = (ulong)(uint)piVar13[(int)DVar1];
      local_98 = (ulong)(piVar13[(int)DVar1] & 0x7fffffff);
      uVar17 = piVar13[iVar9];
      uVar29 = piVar13[iVar2];
      uVar23 = ((uint)n_01 ^ uVar17) & 1;
      uVar25 = (ulong)uVar23;
      local_a8 = (Abc_Obj_t *)(CONCAT44(local_a8._4_4_,uVar17) & 0xffffffff7ffffffe);
      uVar20 = (ulong)(((uint)n_00 ^ uVar29) & 1);
      local_b0 = CONCAT44(local_b0._4_4_,uVar29) & 0xffffffff7ffffffe;
      local_90 = (Abc_Obj_t *)n_01;
      Cudd_RecursiveDeref(pManRst->dd,n_00);
      Cudd_RecursiveDeref(pManRst->dd,(DdNode *)local_90);
      uVar18 = local_98 >> 1 & 0x7fffffff;
      pDVar15 = pGraph->pNodes;
      local_38 = uVar18 * 3;
      uVar28 = (ulong)(uVar17 >> 1 & 0x3fffffff);
      local_40 = uVar28 * 3;
      uVar26 = (ulong)(uVar29 >> 1 & 0x3fffffff);
      local_48 = uVar26 * 3;
      pAVar14 = (Abc_Obj_t *)((ulong)((uint)local_78 & 1) ^ (ulong)pDVar15[uVar18].field_2.pFunc);
      if (pDVar15[uVar18].field_2.pFunc == (void *)0x0) {
        pAVar14 = (Abc_Obj_t *)0x0;
      }
      local_68 = (Abc_Obj_t *)(uVar25 ^ (ulong)pDVar15[uVar28].field_2.pFunc);
      if (pDVar15[uVar28].field_2.pFunc == (void *)0x0) {
        local_68 = (Abc_Obj_t *)0x0;
      }
      pAVar19 = (Abc_Obj_t *)(uVar20 ^ (ulong)pDVar15[uVar26].field_2.pFunc);
      if (pDVar15[uVar26].field_2.pFunc == (void *)0x0) {
        pAVar19 = (Abc_Obj_t *)0x0;
      }
      local_b4 = 0;
      bVar31 = pAVar14 != (Abc_Obj_t *)0x0;
      bVar32 = local_68 != (Abc_Obj_t *)0x0;
      pAVar16 = (Abc_Obj_t *)0x0;
      if ((bVar32 && bVar31) && (pAVar19 != (Abc_Obj_t *)0x0)) {
        local_70 = uVar20;
        pAVar16 = Abc_AigMuxLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar14,local_68,pAVar19,
                                   &local_b4);
        uVar20 = local_70;
      }
      DVar30 = (Dec_Edge_t)((uint)local_a8 | uVar23);
      DVar11 = (Dec_Edge_t)((uint)local_b0._0_4_ | (uint)uVar20);
      local_a8 = pAVar16;
      local_90 = pAVar14;
      local_58 = pAVar19;
      if (local_b4 == 0) {
        local_70 = uVar20;
        if (pGraph->nSize == pGraph->nCap) {
          local_b0 = CONCAT44(local_b0._4_4_,DVar11);
          sVar7 = (long)pGraph->nCap * 0x30;
          local_50 = uVar25;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
          uVar23 = (uint)local_50;
          DVar11 = local_b0._0_4_;
        }
        iVar9 = (int)local_70;
        pDVar4 = pGraph->pNodes;
        iVar10 = pGraph->nSize;
        pGraph->nSize = iVar10 + 1;
        pDVar15 = pDVar4 + iVar10;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar10].field_0x10 = 0;
        pDVar4[iVar10].eEdge0 = SUB84(local_98,0);
        pDVar4[iVar10].eEdge1 = DVar30;
        *(uint *)&pDVar4[iVar10].field_0x10 = uVar23 << 0x10 | ((uint)local_78 & 1) << 0xf;
        iVar10 = pGraph->nSize;
        DVar30 = (Dec_Edge_t)((uint)SUB84(local_98,0) ^ 1);
        if (iVar10 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
          iVar9 = (int)local_70;
        }
        pAVar14 = local_90;
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar15 = pDVar4 + iVar2;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        pDVar4[iVar2].eEdge0 = DVar30;
        pDVar4[iVar2].eEdge1 = DVar11;
        *(uint *)&pDVar4[iVar2].field_0x10 = iVar9 << 0x10 | ((uint)DVar30 & 1) << 0xf;
        iVar9 = pGraph->nSize;
        if (iVar9 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar15 = pDVar4 + iVar2;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        *(undefined4 *)&pDVar4[iVar2].field_0x10 = 0x4000;
        pDVar4[iVar2].eEdge0 = (Dec_Edge_t)(iVar10 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar4[iVar2].eEdge1 = (Dec_Edge_t)(iVar9 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar17 = (pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1;
        pAVar19 = local_58;
      }
      else {
        DVar30 = (Dec_Edge_t)((uint)DVar30 ^ 1);
        if (pGraph->nSize == pGraph->nCap) {
          local_b0 = CONCAT44(local_b0._4_4_,DVar11);
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
          DVar11 = local_b0._0_4_;
        }
        pDVar4 = pGraph->pNodes;
        iVar10 = pGraph->nSize;
        pGraph->nSize = iVar10 + 1;
        pDVar15 = pDVar4 + iVar10;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar10].field_0x10 = 0;
        pDVar4[iVar10].eEdge0 = SUB84(local_98,0);
        pDVar4[iVar10].eEdge1 = DVar30;
        *(uint *)&pDVar4[iVar10].field_0x10 =
             ((uint)DVar30 & 1) << 0x10 | ((uint)local_78 & 1) << 0xf;
        iVar10 = pGraph->nSize;
        DVar24 = (Dec_Edge_t)((uint)SUB84(local_98,0) ^ 1);
        DVar30 = (Dec_Edge_t)((uint)DVar11 ^ 1);
        if (iVar10 == pGraph->nCap) {
          local_b0 = CONCAT44(local_b0._4_4_,DVar11) ^ 1;
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
          DVar30 = local_b0._0_4_;
        }
        pAVar19 = local_58;
        pDVar4 = pGraph->pNodes;
        iVar9 = pGraph->nSize;
        pGraph->nSize = iVar9 + 1;
        pDVar15 = pDVar4 + iVar9;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar9].field_0x10 = 0;
        pDVar4[iVar9].eEdge0 = DVar24;
        pDVar4[iVar9].eEdge1 = DVar30;
        *(uint *)&pDVar4[iVar9].field_0x10 = ((uint)DVar30 & 1) << 0x10 | ((uint)DVar24 & 1) << 0xf;
        iVar9 = pGraph->nSize;
        if (iVar9 == pGraph->nCap) {
          sVar7 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar15 = (Dec_Node_t *)malloc(sVar7);
          }
          else {
            pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
          }
          pGraph->pNodes = pDVar15;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar15 = pDVar4 + iVar2;
        pDVar15->eEdge0 = (Dec_Edge_t)0x0;
        pDVar15->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar15->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        *(undefined4 *)&pDVar4[iVar2].field_0x10 = 0x4000;
        pDVar4[iVar2].eEdge0 = (Dec_Edge_t)(iVar10 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar4[iVar2].eEdge1 = (Dec_Edge_t)(iVar9 * 2 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar17 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
        pAVar14 = local_90;
      }
      piVar13 = local_a0;
      pDVar15 = pGraph->pNodes;
      uVar23 = *(uint *)(&pDVar15->field_0x10 + local_38 * 8) & 0x3fff;
      uVar29 = *(uint *)(&pDVar15->field_0x10 + local_40 * 8) & 0x3fff;
      uVar22 = *(uint *)(&pDVar15->field_0x10 + local_48 * 8) & 0x3fff;
      if (uVar29 < uVar23) {
        uVar29 = uVar23;
      }
      if (uVar29 <= uVar22) {
        uVar29 = uVar22;
      }
      uVar23 = uVar17 >> 1;
      *(uint *)&pDVar15[uVar23].field_0x10 =
           *(uint *)&pDVar15[uVar23].field_0x10 & 0xffffc000 | uVar29 + 2 & 0x3fff;
      if (local_a8 == (Abc_Obj_t *)0x0) {
LAB_002a1491:
        iVar10 = *piVar13;
        *piVar13 = iVar10 + 1;
        if (local_b4 == 0) {
          if (bVar32 && bVar31) {
            pAVar16 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar14,local_68);
            if ((pAVar16 == (Abc_Obj_t *)0x0) ||
               (iVar10 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar16 & 0xfffffffffffffffe))
               , iVar10 != 0)) {
              iVar10 = *piVar13 + 1;
              goto LAB_002a154a;
            }
          }
          else {
            iVar10 = iVar10 + 2;
LAB_002a154a:
            *piVar13 = iVar10;
          }
          if ((pAVar14 != (Abc_Obj_t *)0x0) && (pAVar19 != (Abc_Obj_t *)0x0)) {
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            goto LAB_002a1569;
          }
LAB_002a1589:
          *piVar13 = *piVar13 + 1;
        }
        else {
          if (bVar32 && bVar31) {
            pAVar16 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar14,
                                       (Abc_Obj_t *)((ulong)local_68 ^ 1));
            if ((pAVar16 == (Abc_Obj_t *)0x0) ||
               (iVar10 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar16 & 0xfffffffffffffffe))
               , iVar10 != 0)) {
              iVar10 = *piVar13 + 1;
              goto LAB_002a1522;
            }
          }
          else {
            iVar10 = iVar10 + 2;
LAB_002a1522:
            *piVar13 = iVar10;
          }
          if ((pAVar14 == (Abc_Obj_t *)0x0) || (pAVar19 == (Abc_Obj_t *)0x0)) goto LAB_002a1589;
          pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar19 = (Abc_Obj_t *)((ulong)pAVar19 ^ 1);
LAB_002a1569:
          pAVar14 = Abc_AigAndLookup(pAVar21,(Abc_Obj_t *)((ulong)pAVar14 ^ 1),pAVar19);
          if ((pAVar14 == (Abc_Obj_t *)0x0) ||
             (iVar10 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe)),
             iVar10 != 0)) goto LAB_002a1589;
        }
        if (local_84 < *piVar13) {
LAB_002a1593:
          Vec_IntFree(local_80);
          return (Dec_Edge_t)0xfac;
        }
      }
      else {
        pGraph->pNodes[uVar23].field_2.pFunc = (void *)((ulong)(uVar17 & 1) ^ (ulong)local_a8);
        if ((local_88 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar23].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)local_a8 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x346,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        iVar10 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)local_a8 & 0xfffffffffffffffe));
        if (iVar10 != 0) goto LAB_002a1491;
      }
      Vec_IntFree(local_80);
      local_60._0_4_ = uVar17 ^ (uint)local_60;
      uVar17 = uVar17 & 0xfffffffe;
      goto LAB_002a0c39;
    }
    if (vEdges->nSize < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x27e,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    iVar10 = vEdges->nSize;
    while (1 < iVar10) {
      if (iVar10 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,vEdges,0);
      }
      iVar10 = vEdges->nSize;
      if (iVar10 < 1) goto LAB_002a15c5;
      vEdges->nSize = iVar10 - 1U;
      if (iVar10 == 1) goto LAB_002a15c5;
      uVar17 = vEdges->pArray[iVar10 - 1U];
      vEdges->nSize = iVar10 - 2U;
      uVar29 = vEdges->pArray[iVar10 - 2U];
      uVar23 = uVar29 & 0x7fffffff;
      uVar20 = (ulong)((uVar17 & 0x7fffffff) >> 1);
      local_b0 = uVar20 * 3;
      pvVar3 = pGraph->pNodes[uVar20].field_2.pFunc;
      uVar18 = (ulong)(uVar23 >> 1);
      local_98 = uVar18 * 3;
      uVar20 = (ulong)(uVar17 & 1) ^ (ulong)pvVar3;
      if (pvVar3 == (void *)0x0) {
        uVar20 = 0;
      }
      pvVar3 = pGraph->pNodes[uVar18].field_2.pFunc;
      uVar29 = uVar29 & 1;
      uVar18 = (ulong)uVar29 ^ (ulong)pvVar3;
      if (pvVar3 == (void *)0x0) {
        uVar18 = 0;
      }
      if (uVar20 == 0) {
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        if (uVar18 != 0) {
          pAVar14 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,(Abc_Obj_t *)(uVar20 ^ 1),
                                     (Abc_Obj_t *)(uVar18 ^ 1));
          if (pAVar14 == (Abc_Obj_t *)0x0) {
            uVar26 = 0;
          }
          else {
            uVar26 = (ulong)pAVar14 ^ 1;
          }
        }
      }
      if (pGraph->nSize == pGraph->nCap) {
        sVar7 = (long)pGraph->nCap * 0x30;
        if (pGraph->pNodes == (Dec_Node_t *)0x0) {
          pDVar15 = (Dec_Node_t *)malloc(sVar7);
        }
        else {
          pDVar15 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar7);
        }
        pGraph->pNodes = pDVar15;
        pGraph->nCap = pGraph->nCap << 1;
      }
      vEdges = local_80;
      pDVar4 = pGraph->pNodes;
      iVar10 = pGraph->nSize;
      pGraph->nSize = iVar10 + 1;
      pDVar15 = pDVar4 + iVar10;
      pDVar15->eEdge0 = (Dec_Edge_t)0x0;
      pDVar15->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar15->field_2).pFunc = (void *)0x0;
      *(undefined8 *)&pDVar4[iVar10].field_0x10 = 0;
      *(uint *)&pDVar4[iVar10].field_0x10 = (uVar17 & 1) * 0x8000 + uVar29 * 0x10000 + 0x4000;
      pDVar4[iVar10].eEdge0 = (Dec_Edge_t)(uVar17 & 0x7fffffff ^ 1);
      pDVar4[iVar10].eEdge1 = (Dec_Edge_t)(uVar23 ^ 1);
      uVar23 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
      pDVar15 = pGraph->pNodes;
      uVar29 = *(uint *)(&pDVar15->field_0x10 + local_b0 * 8) & 0x3fff;
      uVar17 = *(uint *)(&pDVar15->field_0x10 + local_98 * 8) & 0x3fff;
      if (uVar17 < uVar29) {
        uVar17 = uVar29;
      }
      uVar29 = uVar23 >> 1;
      *(uint *)&pDVar15[uVar29].field_0x10 =
           *(uint *)&pDVar15[uVar29].field_0x10 & 0xffffc000 | uVar17 + 1 & 0x3fff;
      if (uVar26 == 0) {
LAB_002a04df:
        iVar10 = *local_a0;
        *local_a0 = iVar10 + 1;
        if (local_84 <= iVar10) goto LAB_002a0fd7;
      }
      else {
        pDVar15 = pGraph->pNodes;
        pDVar15[uVar29].field_2.pFunc = (void *)(uVar26 ^ 1);
        if ((local_88 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar29].field_0x10 & 0x3fff) !=
            *(uint *)((uVar26 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x29d,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        plVar27 = (long *)(uVar26 & 0xfffffffffffffffe);
        lVar5 = *plVar27;
        iVar10 = (int)plVar27[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,(int)pDVar15);
        if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002a15e4;
        if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar27 + 0xd8))
        goto LAB_002a04df;
      }
      Abc_NodeEdgeDsdPushOrdered(pGraph,vEdges,uVar23 + 1);
      iVar10 = vEdges->nSize;
    }
  }
  if (iVar10 != 1) {
LAB_002a15c5:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
  }
  __ptr = (uint *)vEdges->pArray;
  vEdges->nSize = 0;
  uVar17 = *__ptr;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
    vEdges->pArray = (int *)0x0;
  }
  if (vEdges != (Vec_Int_t *)0x0) {
    free(vEdges);
  }
  local_60._0_4_ = uVar17 ^ (uint)local_60;
  uVar17 = uVar17 & 0x7ffffffe;
LAB_002a0c39:
  return (Dec_Edge_t)(uVar17 | (uint)local_60 & 1);
}

Assistant:

Dec_Edge_t Abc_NodeEvaluateDsd_rec( Dec_Graph_t * pGraph, Abc_ManRst_t * pManRst, Dsd_Node_t * pNodeDsd, int Required, int nNodesSaved, int * pnNodesAdded )
{
    Dec_Edge_t eNode1, eNode2, eNode3, eResult, eQuit = { 0, 2006 };
    Abc_Obj_t * pNode1, * pNode2, * pNode3, * pNode4, * pTemp;
    Dsd_Node_t * pChildDsd;
    Dsd_Type_t DecType;
    Vec_Int_t * vEdges;
    int Level1, Level2, Level3, Level4;
    int i, Index, fCompl, Type;

    // remove the complemented attribute
    fCompl   = Dsd_IsComplement( pNodeDsd );
    pNodeDsd = Dsd_Regular( pNodeDsd );

    // consider the trivial case
    DecType = Dsd_NodeReadType( pNodeDsd );
    if ( DecType == DSD_NODE_BUF )
    {
        Index = Dsd_NodeReadFunc(pNodeDsd)->index;
        assert( Index < Dec_GraphLeaveNum(pGraph) );
        eResult = Dec_EdgeCreate( Index, fCompl );
        return eResult;
    }
    assert( DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME );

    // solve the problem for the children
    vEdges = Vec_IntAlloc( Dsd_NodeReadDecsNum(pNodeDsd) );
    Dsd_NodeForEachChild( pNodeDsd, i, pChildDsd )
    {
        eResult = Abc_NodeEvaluateDsd_rec( pGraph, pManRst, pChildDsd, Required, nNodesSaved, pnNodesAdded );
        if ( eResult.Node == eQuit.Node ) // infeasible
        {
            Vec_IntFree( vEdges );
            return eQuit;
        }
        // order the inputs only if this is OR or EXOR
        if ( DecType == DSD_NODE_PRIME )
            Vec_IntPush( vEdges, Dec_EdgeToInt(eResult) );
        else
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eResult) );
    }
    // the edges are sorted by the level of their nodes in decreasing order


    // consider special cases
    if ( DecType == DSD_NODE_OR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 0 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
            {
                pNode3 = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) ); 
                pNode3 = !pNode3? NULL : Abc_ObjNot(pNode3);
            }
            // create the new node
            eNode3 = Dec_GraphAddNodeOr( pGraph, eNode1, eNode2 );
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 1 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_EXOR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 1 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            Type = 0;
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
                pNode3 = Abc_AigXorLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, &Type ); 
            // create the new node
            eNode3 = Dec_GraphAddNodeXor( pGraph, eNode1, eNode2, Type ); // should have the same structure as in AIG
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 2 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded) += 2;
                else if ( Type == 0 )
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node is complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_PRIME )
    {
        DdNode * bLocal, * bVar, * bCofT, * bCofE;
        bLocal = Dsd_TreeGetPrimeFunction( pManRst->dd, pNodeDsd );  Cudd_Ref( bLocal );
//Extra_bddPrint( pManRst->dd, bLocal );

        bVar  = pManRst->dd->vars[0];
        bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
        bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
        if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
        {
            Cudd_RecursiveDeref( pManRst->dd, bCofE );
            Cudd_RecursiveDeref( pManRst->dd, bCofT );
            bVar  = pManRst->dd->vars[1];
            bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
            bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
            if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
            {
                Cudd_RecursiveDeref( pManRst->dd, bCofE );
                Cudd_RecursiveDeref( pManRst->dd, bCofT );
                bVar  = pManRst->dd->vars[2];
                bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
                bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
                if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
                {
                    Cudd_RecursiveDeref( pManRst->dd, bCofE );
                    Cudd_RecursiveDeref( pManRst->dd, bCofT );
                    Cudd_RecursiveDeref( pManRst->dd, bLocal );
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
        }
        Cudd_RecursiveDeref( pManRst->dd, bLocal );
        // we found the control variable (bVar) and the var-cofactors (bCofT, bCofE)

        // find the graph nodes
        eNode1 = Dec_IntToEdge( Vec_IntEntry(vEdges, bVar->index) );
        eNode2 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofT)->index) );
        eNode3 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofE)->index) );
        // add the complements to the graph nodes
        eNode2.fCompl ^= Cudd_IsComplement(bCofT);
        eNode3.fCompl ^= Cudd_IsComplement(bCofE);

        // because the cofactors are vars, we can just as well deref them here
        Cudd_RecursiveDeref( pManRst->dd, bCofE );
        Cudd_RecursiveDeref( pManRst->dd, bCofT );

        // find the ABC nodes
        pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
        pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
        pNode3 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode3.Node )->pFunc;
        pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
        pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
        pNode3 = !pNode3? NULL : Abc_ObjNotCond( pNode3, eNode3.fCompl );

        // check if the new node exists
        Type = 0;
        pNode4 = NULL;
        if ( pNode1 && pNode2 && pNode3 )
            pNode4 = Abc_AigMuxLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, pNode3, &Type ); 

        // create the new node
        eResult = Dec_GraphAddNodeMux( pGraph, eNode1, eNode2, eNode3, Type ); // should have the same structure as AIG

        // set level
        Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
        Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
        Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
        Dec_GraphNode( pGraph, eResult.Node )->Level = 2 + Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 );
        // get the new node if possible
        if ( pNode4 )
        {
            Dec_GraphNode( pGraph, eResult.Node )->pFunc = Abc_ObjNotCond(pNode4, eResult.fCompl);
            Level4 = Dec_GraphNode( pGraph, eResult.Node )->Level;
            assert( Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level );
        }
        if ( !pNode4 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode4)) )
        {
            (*pnNodesAdded)++;
            if ( Type == 0 ) 
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode3 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            else
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode3) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            if ( *pnNodesAdded > nNodesSaved )
            {
                Vec_IntFree( vEdges );
                return eQuit;
            }
        }

        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    Vec_IntFree( vEdges );
    return eQuit;
}